

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  char *pcVar1;
  StringRef path_00;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  Style in_R8D;
  Twine *pTVar9;
  ulong uVar10;
  StringRef path_01;
  StringRef SVar11;
  undefined1 local_338 [8];
  SmallString<256U> result;
  undefined1 local_210 [8];
  SmallVector<llvm::StringRef,_16U> components;
  short *local_f0;
  long lStack_e8;
  long local_e0;
  Twine local_d0;
  Child local_b8 [2];
  short *local_a8;
  long lStack_a0;
  long local_98;
  undefined1 auStack_88 [8];
  StringRef C_1;
  StringRef C;
  StringRef local_50;
  ulong local_40;
  Style local_34;
  
  pcVar1 = (char *)(path->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar2 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  SVar11.Length._0_4_ = uVar3;
  SVar11.Data = (char *)uVar2;
  uVar10 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_210 = (undefined1  [8])
              &components.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       (void *)0x1000000000;
  SVar11.Length._4_4_ = 0;
  local_50.Data = pcVar1;
  local_50.Length = uVar10;
  local_34 = style;
  SVar11 = root_path(SVar11,style);
  uVar8 = SVar11.Length;
  if (uVar10 < SVar11.Length) {
    uVar8 = uVar10;
  }
  pTVar9 = (Twine *)(pcVar1 + uVar8);
  path_01.Length._0_4_ = local_34;
  path_01.Data = (char *)(uVar10 - uVar8);
  path_01.Length._4_4_ = 0;
  begin((const_iterator *)
        (components.super_SmallVectorStorage<llvm::StringRef,_16U>.InlineElts[0xf].buffer + 8),
        (path *)pTVar9,path_01,in_R8D);
  local_98 = local_e0;
  local_a8 = local_f0;
  lStack_a0 = lStack_e8;
  local_b8[0] = (Child)components.super_SmallVectorStorage<llvm::StringRef,_16U>.InlineElts[0xf].
                       buffer._8_8_;
  do {
    if ((local_b8[0].twine == pTVar9) && (local_98 == uVar10 - uVar8)) {
      path_00.Length = local_50.Length;
      path_00.Data = local_50.Data;
      SVar11 = root_path(path_00,local_34);
      SmallVector<char,256u>::SmallVector<char_const*,void>
                ((SmallVector<char,256u> *)local_338,SVar11.Data,SVar11.Data + SVar11.Length);
      auVar4 = local_210;
      local_40 = (ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase
                        .BeginX & 0xffffffff;
      if (local_40 != 0) {
        local_40 = local_40 << 4;
        uVar8 = 0;
        pTVar9 = (Twine *)(result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>
                           .InlineElts + 0xf8);
        do {
          auStack_88 = *(undefined1 (*) [8])((long)auVar4 + uVar8);
          C_1.Data = (char *)((undefined8 *)((long)auVar4 + uVar8))[1];
          Twine::Twine((Twine *)local_b8,(StringRef *)auStack_88);
          Twine::Twine(&local_d0,"");
          Twine::Twine((Twine *)&C_1.Length,"");
          Twine::Twine(pTVar9,"");
          append((SmallVectorImpl<char> *)local_338,local_34,(Twine *)local_b8,&local_d0,
                 (Twine *)&C_1.Length,pTVar9);
          uVar8 = uVar8 + 0x10;
        } while (local_40 != uVar8);
      }
      if (local_210 !=
          (undefined1  [8])
          &components.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
        free((void *)local_210);
      }
      if ((uint)result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (path->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
        if ((ulong)(uint)result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                         super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
            0) {
          bVar5 = true;
        }
        else {
          iVar6 = bcmp((void *)local_338,
                       (path->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                       (ulong)(uint)result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>
                                    .super_SmallVectorTemplateBase<char,_true>.
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.BeginX);
          bVar5 = iVar6 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5 == false) {
        SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_338);
      }
      if (local_338 !=
          (undefined1  [8])
          &result.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase.Size) {
        free((void *)local_338);
      }
      return (bool)(bVar5 ^ 1);
    }
    C_1.Length = (size_t)local_a8;
    if ((lStack_a0 != 1) || ((char)*local_a8 != '.')) {
      if ((lStack_a0 == 2 && remove_dot_dot) && (*local_a8 == 0x2e2e)) {
        uVar7 = (ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX & 0xffffffff;
        if ((uVar7 == 0) ||
           ((*(long *)((long)local_210 + (uVar7 * 4 + -2) * 4) == 2 &&
            (**(short **)((long)local_210 + (uVar7 * 4 + -4) * 4) == 0x2e2e)))) {
          Twine::Twine(&local_d0,&local_50);
          bVar5 = is_absolute(&local_d0,local_34);
          if (!bVar5) goto LAB_00db3c75;
        }
        else {
          if ((ulong)components.super_SmallVectorImpl<llvm::StringRef>.
                     super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX._4_4_ < uVar7 - 1) {
            __assert_fail("N <= capacity()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          components.super_SmallVectorImpl<llvm::StringRef>.
          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
               (void *)CONCAT44(components.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX._4_4_,(int)(uVar7 - 1));
        }
      }
      else {
LAB_00db3c75:
        SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::StringRef,_true> *)local_210,
                   (StringRef *)&C_1.Length);
      }
    }
    const_iterator::operator++((const_iterator *)local_b8);
  } while( true );
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}